

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O0

int deletePointAtIndex(DelaunayTriangulation *delTri,GLsizei i_p)

{
  GLfloat (*paGVar1) [2];
  int local_30;
  int local_2c;
  GLsizei i_1;
  GLsizei i;
  GLfloat (*points) [2];
  GLsizei i_p_local;
  DelaunayTriangulation *delTri_local;
  
  if (delTri->n_points == 0) {
    delTri_local._4_4_ = 0;
  }
  else {
    delTri->n_points = delTri->n_points + -1;
    paGVar1 = (GLfloat (*) [2])malloc((long)delTri->n_points << 3);
    for (local_2c = 0; local_30 = i_p, local_2c < i_p; local_2c = local_2c + 1) {
      paGVar1[local_2c][0] = delTri->points[local_2c][0];
      paGVar1[local_2c][1] = delTri->points[local_2c][1];
    }
    for (; local_30 < delTri->n_points; local_30 = local_30 + 1) {
      paGVar1[local_30][0] = delTri->points[local_30 + 1][0];
      paGVar1[local_30][1] = delTri->points[local_30 + 1][1];
    }
    free(delTri->points);
    delTri->points = paGVar1;
    resetDelaunayTriangulation(delTri);
    delTri_local._4_4_ = 1;
  }
  return delTri_local._4_4_;
}

Assistant:

int deletePointAtIndex(DelaunayTriangulation *delTri, GLsizei i_p) {
	if (delTri->n_points == 0) {
		return 0;
	}

	delTri->n_points -= 1;
	GLfloat (*points)[2] = malloc(sizeof(delTri->points[0]) * delTri->n_points);

	for (GLsizei i = 0; i < i_p; i++) {
		points[i][0] = delTri->points[i][0];
		points[i][1] = delTri->points[i][1];
	}
	for (GLsizei i = i_p; i < delTri->n_points; i++) {
		points[i][0] = delTri->points[i + 1][0];
		points[i][1] = delTri->points[i + 1][1];
	}

	free(delTri->points);
	delTri->points = points;

	resetDelaunayTriangulation(delTri);
	return 1;
}